

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int findlabel(LexState *ls,int g)

{
  Dyndata *pDVar1;
  BlockCnt *pBVar2;
  Labeldesc *pLVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  Labeldesc *pLVar7;
  
  pDVar1 = ls->dyd;
  pBVar2 = ls->fs->bl;
  if ((int)pBVar2->firstlabel < (pDVar1->label).n) {
    pLVar7 = (pDVar1->gt).arr + g;
    lVar6 = (long)(int)pBVar2->firstlabel;
    lVar5 = lVar6 * 0x18;
    do {
      pLVar3 = (pDVar1->label).arr;
      iVar4 = luaS_eqstr(*(TString **)((long)&pLVar3->name + lVar5),pLVar7->name);
      if (iVar4 != 0) {
        if (((&pLVar3->nactvar)[lVar5] < pLVar7->nactvar) &&
           ((pBVar2->upval != '\0' || ((int)pBVar2->firstlabel < (pDVar1->label).n)))) {
          luaK_patchclose(ls->fs,pLVar7->pc,(uint)(&pLVar3->nactvar)[lVar5]);
        }
        closegoto(ls,g,(Labeldesc *)((long)&pLVar3->name + lVar5));
        return 1;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar6 < (pDVar1->label).n);
  }
  return 0;
}

Assistant:

static int findlabel (LexState *ls, int g) {
  int i;
  BlockCnt *bl = ls->fs->bl;
  Dyndata *dyd = ls->dyd;
  Labeldesc *gt = &dyd->gt.arr[g];
  /* check labels in current block for a match */
  for (i = bl->firstlabel; i < dyd->label.n; i++) {
    Labeldesc *lb = &dyd->label.arr[i];
    if (luaS_eqstr(lb->name, gt->name)) {  /* correct label? */
      if (gt->nactvar > lb->nactvar &&
          (bl->upval || dyd->label.n > bl->firstlabel))
        luaK_patchclose(ls->fs, gt->pc, lb->nactvar);
      closegoto(ls, g, lb);  /* close it */
      return 1;
    }
  }
  return 0;  /* label not found; cannot close goto */
}